

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O3

void __thiscall xray_re::xr_ini_writer::close_section(xr_ini_writer *this)

{
  _Map_pointer ppbVar1;
  
  xr_writer::w_sf((xr_writer *)this,"\n");
  ppbVar1 = (this->m_section_stack).c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->m_section_stack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->m_section_stack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
      ((long)(this->m_section_stack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->m_section_stack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)ppbVar1 -
                (long)(this->m_section_stack).c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppbVar1 == (_Map_pointer)0x0)) * 0x10 == 0) {
    msg("couldn\'t close section, because %s was open","none");
    return;
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&(this->m_section_stack).c);
  return;
}

Assistant:

void xr_ini_writer::close_section()
{
	w_sf("\n");
	if (m_section_stack.size() > 0)
		m_section_stack.pop();
	else
		msg("couldn't close section, because %s was open", "none");
}